

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  MessageBuilderLiteGenerator builderGenerator;
  MessageBuilderLiteGenerator MStack_58;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&MStack_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return (Builder) DEFAULT_INSTANCE.createBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n}\n\n"
             ,(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MStack_58);
  std::__cxx11::string::~string((string *)&MStack_58);
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            (&MStack_58,(this->super_MessageGenerator).descriptor_,this->context_);
  MessageBuilderLiteGenerator::Generate(&MStack_58,printer);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator(&MStack_58);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}